

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O2

int coda_cursor_read_char(coda_cursor *cursor,char *dst)

{
  coda_backend cVar1;
  coda_dynamic_type_struct *pcVar2;
  int iVar3;
  undefined8 in_RAX;
  char *pcVar4;
  undefined8 uVar5;
  coda_native_type read_type;
  
  read_type = (coda_native_type)((ulong)in_RAX >> 0x20);
  if (((cursor == (coda_cursor *)0x0) || (cursor->n < 1)) ||
     (pcVar2 = cursor->stack[cursor->n - 1].type, pcVar2 == (coda_dynamic_type_struct *)0x0)) {
    pcVar4 = "invalid cursor argument (%s:%u)";
    uVar5 = 0xa8a;
  }
  else {
    if (dst != (char *)0x0) {
      get_read_type(cursor,&read_type);
      if (read_type != coda_native_type_char) {
        pcVar4 = coda_type_get_native_type_name(read_type);
        coda_set_error(-0x69,"can not read %s data using a char data type",pcVar4);
        return -1;
      }
      cVar1 = pcVar2->backend;
      switch(cVar1) {
      case coda_backend_memory:
        iVar3 = coda_mem_cursor_read_char(cursor,dst);
        break;
      case coda_backend_hdf4:
        coda_set_error(-0xb,(char *)0x0);
        return -1;
      case coda_backend_hdf5:
switchD_001259ed_caseD_66:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                      ,0x2d2,"int read_char(const coda_cursor *, char *)");
      case coda_backend_cdf:
        iVar3 = coda_cdf_cursor_read_char(cursor,dst);
        break;
      case coda_backend_netcdf:
        iVar3 = coda_netcdf_cursor_read_char(cursor,dst);
        break;
      default:
        if (cVar1 == coda_backend_binary) {
          iVar3 = coda_bin_cursor_read_char(cursor,dst);
        }
        else {
          if (cVar1 != coda_backend_ascii) goto switchD_001259ed_caseD_66;
          iVar3 = coda_ascii_cursor_read_char(cursor,dst);
        }
      }
      return -(uint)(iVar3 != 0);
    }
    pcVar4 = "dst argument is NULL (%s:%u)";
    uVar5 = 0xa8f;
  }
  coda_set_error(-100,pcVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                 ,uVar5);
  return -1;
}

Assistant:

LIBCODA_API int coda_cursor_read_char(const coda_cursor *cursor, char *dst)
{
    coda_native_type read_type;

    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (dst == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dst argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    if (get_read_type(cursor, &read_type) != 0)
    {
        return -1;
    }
    switch (read_type)
    {
        case coda_native_type_char:
            if (read_char(cursor, dst) != 0)
            {
                return -1;
            }
            break;
        default:
            coda_set_error(CODA_ERROR_INVALID_TYPE, "can not read %s data using a char data type",
                           coda_type_get_native_type_name(read_type));
            return -1;
    }

    return 0;
}